

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
          (ImmutableMessageFieldGenerator *this,Printer *printer,char *method_prototype,
          char *regular_case,char *nested_builder_case,char *trailing_code,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  size_t sVar1;
  string_view begin_varname;
  string_view text;
  string_view text_00;
  string_view end_varname;
  string_view text_01;
  string_view text_02;
  
  sVar1 = strlen(method_prototype);
  text_01._M_str = method_prototype;
  text_01._M_len = sVar1;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text_01);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,this->descriptor_,semantic);
  text._M_str = " {\n";
  text._M_len = 3;
  io::Printer::Print<>(printer,text);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[0x15])
            (this,printer,regular_case,nested_builder_case);
  if (trailing_code != (char *)0x0) {
    sVar1 = strlen(trailing_code);
    text_02._M_str = trailing_code;
    text_02._M_len = sVar1;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&this->variables_,text_02);
  }
  io::Printer::Outdent(printer);
  text_00._M_str = "}\n";
  text_00._M_len = 2;
  io::Printer::Print<>(printer,text_00);
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::PrintNestedBuilderFunction(
    io::Printer* printer, const char* method_prototype,
    const char* regular_case, const char* nested_builder_case,
    const char* trailing_code,
    absl::optional<io::AnnotationCollector::Semantic> semantic) const {
  printer->Print(variables_, method_prototype);
  printer->Annotate("{", "}", descriptor_, semantic);
  printer->Print(" {\n");
  printer->Indent();
  PrintNestedBuilderCondition(printer, regular_case, nested_builder_case);
  if (trailing_code != nullptr) {
    printer->Print(variables_, trailing_code);
  }
  printer->Outdent();
  printer->Print("}\n");
}